

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

Message * __thiscall
google::protobuf::Reflection::ReleaseLast(Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  int number;
  Reflection *pRVar4;
  Descriptor *actual;
  Descriptor *pDVar5;
  ExtensionSet *this_00;
  MapFieldBase *this_01;
  RepeatedPtrFieldBase *pRVar6;
  MessageLite *local_28;
  Message *released;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  pRVar4 = Message::GetReflection(message);
  if (this != pRVar4) {
    pDVar5 = this->descriptor_;
    actual = Message::GetDescriptor(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar5,actual,field,"ReleaseLast");
  }
  pDVar5 = FieldDescriptor::containing_type(field);
  if (pDVar5 != this->descriptor_) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"ReleaseLast","Field does not match message type.");
  }
  LVar2 = FieldDescriptor::label(field);
  if (LVar2 != LABEL_REPEATED) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"ReleaseLast",
               "Field is singular; the method requires a repeated field.");
  }
  CVar3 = FieldDescriptor::cpp_type(field);
  if (CVar3 != CPPTYPE_MESSAGE) {
    anon_unknown_6::ReportReflectionUsageTypeError
              (this->descriptor_,field,"ReleaseLast",CPPTYPE_MESSAGE);
  }
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    this_00 = MutableExtensionSet(this,message);
    number = FieldDescriptor::number(field);
    local_28 = internal::ExtensionSet::ReleaseLast(this_00,number);
  }
  else {
    bVar1 = anon_unknown_6::IsMapFieldInApi(field);
    if (bVar1) {
      this_01 = MutableRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
      pRVar6 = internal::MapFieldBase::MutableRepeatedField(this_01);
      local_28 = &internal::RepeatedPtrFieldBase::
                  ReleaseLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                            (pRVar6)->super_MessageLite;
    }
    else {
      pRVar6 = MutableRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,field);
      local_28 = &internal::RepeatedPtrFieldBase::
                  ReleaseLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                            (pRVar6)->super_MessageLite;
    }
  }
  return (Message *)local_28;
}

Assistant:

Message* Reflection::ReleaseLast(Message* message,
                                 const FieldDescriptor* field) const {
  USAGE_MUTABLE_CHECK_ALL(ReleaseLast, REPEATED, MESSAGE);

  Message* released;
  if (field->is_extension()) {
    released = static_cast<Message*>(
        MutableExtensionSet(message)->ReleaseLast(field->number()));
  } else {
    if (IsMapFieldInApi(field)) {
      released = MutableRaw<MapFieldBase>(message, field)
                     ->MutableRepeatedField()
                     ->ReleaseLast<GenericTypeHandler<Message>>();
    } else {
      released = MutableRaw<RepeatedPtrFieldBase>(message, field)
                     ->ReleaseLast<GenericTypeHandler<Message>>();
    }
  }
  if (internal::DebugHardenForceCopyInRelease()) {
    return MaybeForceCopy(message->GetArena(), released);
  } else {
    return released;
  }
}